

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_read__null
                    (ma_device *pDevice,void *pPCMFrames,ma_uint32 frameCount,ma_uint32 *pFramesRead
                    )

{
  ma_uint32 *pmVar1;
  uint uVar2;
  ma_uint32 mVar3;
  ma_uint32 mVar4;
  ma_uint64 mVar5;
  int iVar6;
  uint uVar7;
  ma_uint32 mVar8;
  timespec local_40;
  
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = 0;
  }
  mVar8 = 0;
  do {
    uVar7 = frameCount - mVar8;
    if (frameCount < mVar8 || uVar7 == 0) break;
    uVar2 = (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture;
    if (uVar2 != 0) {
      iVar6 = (&DAT_001157a0)[(pDevice->capture).internalFormat] *
              (pDevice->capture).internalChannels;
      if (uVar2 < uVar7) {
        uVar7 = uVar2;
      }
      memset((void *)((ulong)(iVar6 * mVar8) + (long)pPCMFrames),0,(ulong)(iVar6 * uVar7));
      pmVar1 = &(pDevice->field_23).null_device.currentPeriodFramesRemainingCapture;
      *pmVar1 = *pmVar1 - uVar7;
      mVar8 = mVar8 + uVar7;
    }
    if ((pDevice->field_23).null_device.currentPeriodFramesRemainingCapture == 0) {
      (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture = 0;
    }
    if (frameCount <= mVar8 && mVar8 != frameCount) {
      __assert_fail("totalPCMFramesProcessed <= frameCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x25c1,
                    "ma_result ma_device_read__null(ma_device *, void *, ma_uint32, ma_uint32 *)");
    }
    if (mVar8 == frameCount) break;
    if ((pDevice->field_23).null_device.isStarted != 0) {
      mVar3 = (pDevice->capture).internalPeriodSizeInFrames;
      mVar4 = (pDevice->field_23).null_device.lastProcessedFrameCapture;
      do {
        mVar5 = ma_device_get_total_run_time_in_frames__null(pDevice);
        if (mVar3 + mVar4 <= mVar5) break;
        local_40.tv_sec = 0;
        local_40.tv_nsec = 10000000;
        nanosleep(&local_40,(timespec *)0x0);
      } while ((pDevice->field_23).null_device.isStarted != 0);
    }
    mVar3 = (pDevice->capture).internalPeriodSizeInFrames;
    pmVar1 = &(pDevice->field_23).null_device.lastProcessedFrameCapture;
    *pmVar1 = *pmVar1 + mVar3;
    (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture = mVar3;
  } while (mVar8 != frameCount);
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = mVar8;
  }
  return (ma_result)pFramesRead;
}

Assistant:

static ma_result ma_device_read__null(ma_device* pDevice, void* pPCMFrames, ma_uint32 frameCount, ma_uint32* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint32 totalPCMFramesProcessed;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    /* Keep going until everything has been read. */
    totalPCMFramesProcessed = 0;
    while (totalPCMFramesProcessed < frameCount) {
        ma_uint64 targetFrame;

        /* If there are any frames remaining in the current period, consume those first. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture > 0) {
            ma_uint32 bpf = ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
            ma_uint32 framesRemaining = (frameCount - totalPCMFramesProcessed);
            ma_uint32 framesToProcess = pDevice->null_device.currentPeriodFramesRemainingCapture;
            if (framesToProcess > framesRemaining) {
                framesToProcess = framesRemaining;
            }

            /* We need to ensured the output buffer is zeroed. */
            MA_ZERO_MEMORY(ma_offset_ptr(pPCMFrames, totalPCMFramesProcessed*bpf), framesToProcess*bpf);

            pDevice->null_device.currentPeriodFramesRemainingCapture -= framesToProcess;
            totalPCMFramesProcessed += framesToProcess;
        }

        /* If we've consumed the current period we'll need to mark it as such an ensure the device is started if it's not already. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture == 0) {
            pDevice->null_device.currentPeriodFramesRemainingCapture = 0;
        }

        /* If we've consumed the whole buffer we can return now. */
        MA_ASSERT(totalPCMFramesProcessed <= frameCount);
        if (totalPCMFramesProcessed == frameCount) {
            break;
        }

        /* Getting here means we've still got more frames to consume, we but need to wait for it to become available. */
        targetFrame = pDevice->null_device.lastProcessedFrameCapture + pDevice->capture.internalPeriodSizeInFrames;
        for (;;) {
            ma_uint64 currentFrame;

            /* Stop waiting if the device has been stopped. */
            if (!pDevice->null_device.isStarted) {
                break;
            }

            currentFrame = ma_device_get_total_run_time_in_frames__null(pDevice);
            if (currentFrame >= targetFrame) {
                break;
            }

            /* Getting here means we haven't yet reached the target sample, so continue waiting. */
            ma_sleep(10);
        }

        pDevice->null_device.lastProcessedFrameCapture          += pDevice->capture.internalPeriodSizeInFrames;
        pDevice->null_device.currentPeriodFramesRemainingCapture = pDevice->capture.internalPeriodSizeInFrames;
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalPCMFramesProcessed;
    }

    return result;
}